

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

void Pln_ManStop(Pln_Man_t *p)

{
  Pln_Man_t *p_local;
  
  Hsh_VecManStop(p->pHashC);
  Hsh_VecManStop(p->pHashM);
  Vec_QueFree(p->vQue);
  Vec_FltFree(p->vCounts);
  Vec_IntFree(p->vCoefs);
  Vec_IntFree(p->vTempC[0]);
  Vec_IntFree(p->vTempC[1]);
  Vec_IntFree(p->vTempM[0]);
  Vec_IntFree(p->vTempM[1]);
  Vec_IntFree(p->vTempM[2]);
  Vec_IntFree(p->vTempM[3]);
  if (p != (Pln_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Pln_ManStop( Pln_Man_t * p )
{
    Hsh_VecManStop( p->pHashC );
    Hsh_VecManStop( p->pHashM );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    Vec_IntFree( p->vCoefs );
    Vec_IntFree( p->vTempC[0] );
    Vec_IntFree( p->vTempC[1] );
    Vec_IntFree( p->vTempM[0] );
    Vec_IntFree( p->vTempM[1] );
    Vec_IntFree( p->vTempM[2] );
    Vec_IntFree( p->vTempM[3] );
    //Vec_IntFree( p->vOrder );
    ABC_FREE( p );
}